

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O1

Label __thiscall
asmjit::CodeEmitter::getLabelByName
          (CodeEmitter *this,char *name,size_t nameLength,uint32_t parentId)

{
  uint32_t uVar1;
  _func_int **pp_Var2;
  undefined4 in_register_0000000c;
  size_t extraout_RDX;
  uint32_t in_R8D;
  Label LVar3;
  
  if (*(CodeHolder **)(name + 0x18) == (CodeHolder *)0x0) {
    pp_Var2 = (_func_int **)0x4;
  }
  else {
    uVar1 = CodeHolder::getLabelIdByName
                      (*(CodeHolder **)(name + 0x18),(char *)nameLength,
                       CONCAT44(in_register_0000000c,parentId),in_R8D);
    pp_Var2 = (_func_int **)((ulong)uVar1 << 0x20 | 4);
    nameLength = extraout_RDX;
  }
  this->_vptr_CodeEmitter = pp_Var2;
  (this->_codeInfo)._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (this->_codeInfo).field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  LVar3.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)nameLength;
  LVar3.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)this;
  return (Label)LVar3.super_Operand.super_Operand_.field_0;
}

Assistant:

Label CodeEmitter::getLabelByName(const char* name, size_t nameLength, uint32_t parentId) noexcept {
  return Label(_code ? _code->getLabelIdByName(name, nameLength, parentId) : static_cast<uint32_t>(0));
}